

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdSkel.cc
# Opt level: O1

bool tinyusdz::BuildSkelTopology
               (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *joints,
               vector<int,_std::allocator<int>_> *dst,string *err)

{
  pointer pTVar1;
  undefined8 uVar2;
  bool bVar3;
  pointer pTVar4;
  mapped_type_conflict2 *pmVar5;
  const_iterator cVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  long lVar8;
  string *p_00;
  Path *in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  mapped_type_conflict2 mVar9;
  int iVar10;
  ulong uVar11;
  bool bVar12;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  pathMap;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> paths;
  Path p;
  string _err;
  undefined1 local_260 [24];
  undefined1 local_248 [32];
  _Base_ptr local_228;
  size_t local_220;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> local_218;
  vector<int,_std::allocator<int>_> *local_200;
  undefined1 local_1f8 [200];
  bool local_130;
  pointer local_128;
  long *local_120 [2];
  long local_110 [2];
  Path local_100;
  
  pTVar4 = (joints->super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pTVar1 = (joints->super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pTVar4 == pTVar1) {
    bVar12 = true;
  }
  else {
    local_200 = dst;
    ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::vector
              (&local_218,(long)pTVar1 - (long)pTVar4 >> 5,(allocator_type *)local_1f8);
    local_260._0_8_ = (pointer)0x0;
    pTVar4 = (joints->super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>)._M_impl
             .super__Vector_impl_data._M_start;
    bVar12 = (joints->super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>)._M_impl
             .super__Vector_impl_data._M_finish == pTVar4;
    if (!bVar12) {
      local_260._8_8_ = err;
      local_260._16_8_ = joints;
      do {
        paVar7 = &local_100._prim_part.field_2;
        p_00 = &pTVar4[local_260._0_8_].str_;
        local_100._prim_part._M_dataplus._M_p = (pointer)paVar7;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"");
        Path::Path((Path *)local_1f8,p_00,&local_100._prim_part);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._prim_part._M_dataplus._M_p != paVar7) {
          operator_delete(local_100._prim_part._M_dataplus._M_p,
                          CONCAT71(local_100._prim_part.field_2._M_allocated_capacity._1_7_,
                                   local_100._prim_part.field_2._M_local_buf[0]) + 1);
        }
        uVar2 = local_260._8_8_;
        if (local_130 == false) {
          if ((string *)local_260._8_8_ != (string *)0x0) {
            local_248._0_8_ = local_248 + 0x10;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_248,"joints[{}] is invalid Prim path: `{}`","");
            fmt::format<unsigned_long,std::__cxx11::string>
                      (&local_100._prim_part,(fmt *)local_248,(string *)local_260,
                       (unsigned_long *)
                       ((joints->
                        super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>).
                        _M_impl.super__Vector_impl_data._M_start + local_260._0_8_),
                       &in_R8->_prim_part);
LAB_003eee2e:
            ::std::__cxx11::string::_M_append
                      ((char *)uVar2,(ulong)local_100._prim_part._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_100._prim_part._M_dataplus._M_p != paVar7) {
              operator_delete(local_100._prim_part._M_dataplus._M_p,
                              CONCAT71(local_100._prim_part.field_2._M_allocated_capacity._1_7_,
                                       local_100._prim_part.field_2._M_local_buf[0]) + 1);
            }
            if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
              operator_delete((void *)local_248._0_8_,(ulong)(local_248._16_8_ + 1));
            }
          }
LAB_003eee6a:
          if ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)local_1f8._160_8_ !=
              (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)(local_1f8 + 0xb0)) {
            operator_delete((void *)local_1f8._160_8_,local_1f8._176_8_ + 1);
          }
          if ((undefined1 *)local_1f8._128_8_ != local_1f8 + 0x90) {
            operator_delete((void *)local_1f8._128_8_,local_1f8._144_8_ + 1);
          }
          if ((undefined1 *)local_1f8._96_8_ != local_1f8 + 0x70) {
            operator_delete((void *)local_1f8._96_8_,local_1f8._112_8_ + 1);
          }
          if ((undefined1 *)local_1f8._64_8_ != local_1f8 + 0x50) {
            operator_delete((void *)local_1f8._64_8_,local_1f8._80_8_ + 1);
          }
          if ((undefined1 *)local_1f8._32_8_ != local_1f8 + 0x30) {
            operator_delete((void *)local_1f8._32_8_,local_1f8._48_8_ + 1);
          }
          if ((undefined1 *)local_1f8._0_8_ != local_1f8 + 0x10) {
            operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
          }
          goto LAB_003eef45;
        }
        if ((local_1f8._8_8_ == 1) && (*(char *)local_1f8._0_8_ == '/')) {
          if ((string *)local_260._8_8_ != (string *)0x0) {
            local_248._0_8_ = local_248 + 0x10;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_248,
                       "joints[{}] Root Prim path \'/\' cannot be used for joint Prim path.","");
            fmt::format<unsigned_long>
                      (&local_100._prim_part,(string *)local_248,(unsigned_long *)local_260);
            goto LAB_003eee2e;
          }
          goto LAB_003eee6a;
        }
        local_100._prim_part._M_string_length = 0;
        local_100._prim_part.field_2._M_local_buf[0] = '\0';
        local_100._prim_part._M_dataplus._M_p = (pointer)paVar7;
        bVar3 = pathutil::ValidatePrimPath((Path *)local_1f8,&local_100._prim_part);
        if (bVar3) {
          Path::operator=(local_218.
                          super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                          _M_impl.super__Vector_impl_data._M_start + local_260._0_8_,
                          (Path *)local_1f8);
        }
        else if ((string *)local_260._8_8_ != (string *)0x0) {
          local_120[0] = local_110;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_120,"joints[{}] is not a valid Prim path: `{}`, reason = {}",""
                    );
          in_R8 = &local_100;
          fmt::format<unsigned_long,std::__cxx11::string,std::__cxx11::string>
                    ((string *)local_248,(fmt *)local_120,(string *)local_260,
                     (unsigned_long *)
                     ((joints->super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                      )._M_impl.super__Vector_impl_data._M_start + local_260._0_8_),
                     &local_100._prim_part,in_R9);
          ::std::__cxx11::string::_M_append((char *)local_260._8_8_,local_248._0_8_);
          if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
            operator_delete((void *)local_248._0_8_,(ulong)(local_248._16_8_ + 1));
          }
          joints = (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)local_260._16_8_;
          if (local_120[0] != local_110) {
            operator_delete(local_120[0],local_110[0] + 1);
            joints = (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)local_260._16_8_;
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._prim_part._M_dataplus._M_p != &local_100._prim_part.field_2) {
          operator_delete(local_100._prim_part._M_dataplus._M_p,
                          CONCAT71(local_100._prim_part.field_2._M_allocated_capacity._1_7_,
                                   local_100._prim_part.field_2._M_local_buf[0]) + 1);
        }
        if ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)local_1f8._160_8_ !=
            (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)(local_1f8 + 0xb0)) {
          operator_delete((void *)local_1f8._160_8_,local_1f8._176_8_ + 1);
        }
        if ((undefined1 *)local_1f8._128_8_ != local_1f8 + 0x90) {
          operator_delete((void *)local_1f8._128_8_,local_1f8._144_8_ + 1);
        }
        if ((undefined1 *)local_1f8._96_8_ != local_1f8 + 0x70) {
          operator_delete((void *)local_1f8._96_8_,local_1f8._112_8_ + 1);
        }
        if ((undefined1 *)local_1f8._64_8_ != local_1f8 + 0x50) {
          operator_delete((void *)local_1f8._64_8_,local_1f8._80_8_ + 1);
        }
        if ((undefined1 *)local_1f8._32_8_ != local_1f8 + 0x30) {
          operator_delete((void *)local_1f8._32_8_,local_1f8._48_8_ + 1);
        }
        if ((undefined1 *)local_1f8._0_8_ != local_1f8 + 0x10) {
          operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
        }
        if (!bVar3) goto LAB_003eef45;
        local_260._0_8_ = local_260._0_8_ + 1;
        pTVar4 = (joints->super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        bVar3 = (ulong)local_260._0_8_ <
                (pointer)((long)(joints->
                                super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                )._M_impl.super__Vector_impl_data._M_finish - (long)pTVar4 >> 5);
        bVar12 = !bVar3;
      } while (bVar3);
    }
    local_248._24_8_ = local_248 + 8;
    local_248._8_4_ = _S_red;
    local_248._16_8_ = (_Link_type)0x0;
    local_220 = 0;
    local_228 = (_Base_ptr)local_248._24_8_;
    if (local_218.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_218.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
        super__Vector_impl_data._M_start) {
      lVar8 = 0;
      uVar11 = 0;
      do {
        pmVar5 = ::std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                               *)local_248,
                              (key_type *)
                              ((long)&((local_218.
                                        super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->_prim_part).
                                      _M_dataplus._M_p + lVar8));
        *pmVar5 = (mapped_type_conflict2)uVar11;
        uVar11 = uVar11 + 1;
        lVar8 = lVar8 + 0xd0;
      } while (uVar11 < (ulong)(((long)local_218.
                                       super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_218.
                                       super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 4) *
                               0x4ec4ec4ec4ec4ec5));
    }
    ::std::vector<int,_std::allocator<int>_>::resize
              (local_200,
               (long)(joints->super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>)
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(joints->super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>)
                     ._M_impl.super__Vector_impl_data._M_start >> 5);
    if (local_218.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_218.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
        super__Vector_impl_data._M_start) {
      local_260._8_8_ = &local_100._element.field_2;
      local_260._16_8_ = local_1f8 + 0xb0;
      local_128 = local_1f8 + 0x90;
      uVar11 = 0;
      do {
        if (((local_218.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
              super__Vector_impl_data._M_start[uVar11]._valid != true) ||
            (local_218.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
             super__Vector_impl_data._M_start[uVar11]._prim_part._M_string_length != 1)) ||
           (mVar9 = -1,
           *local_218.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
            super__Vector_impl_data._M_start[uVar11]._prim_part._M_dataplus._M_p != '/')) {
          Path::get_parent_prim_path
                    ((Path *)local_1f8,
                     local_218.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                     _M_impl.super__Vector_impl_data._M_start + uVar11);
          iVar10 = 0x20000;
          do {
            mVar9 = -1;
            if ((local_130 != true) || ((local_1f8._8_8_ == 1 && (*(char *)local_1f8._0_8_ == '/')))
               ) break;
            cVar6 = ::std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                    ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                            *)local_248,(key_type *)local_1f8);
            if (cVar6._M_node != (_Base_ptr)(local_248 + 8)) {
              pmVar5 = ::std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                       ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                             *)local_248,(key_type *)local_1f8);
              mVar9 = *pmVar5;
              break;
            }
            Path::get_parent_prim_path(&local_100,(Path *)local_1f8);
            Path::operator=((Path *)local_1f8,&local_100);
            if (local_100._element._M_dataplus._M_p != (pointer)local_260._8_8_) {
              operator_delete(local_100._element._M_dataplus._M_p,
                              local_100._element.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_100._variant_part_str._M_dataplus._M_p !=
                &local_100._variant_part_str.field_2) {
              operator_delete(local_100._variant_part_str._M_dataplus._M_p,
                              local_100._variant_part_str.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_100._variant_selection_part._M_dataplus._M_p !=
                &local_100._variant_selection_part.field_2) {
              operator_delete(local_100._variant_selection_part._M_dataplus._M_p,
                              local_100._variant_selection_part.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_100._variant_part._M_dataplus._M_p != &local_100._variant_part.field_2) {
              operator_delete(local_100._variant_part._M_dataplus._M_p,
                              local_100._variant_part.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_100._prop_part._M_dataplus._M_p != &local_100._prop_part.field_2) {
              operator_delete(local_100._prop_part._M_dataplus._M_p,
                              local_100._prop_part.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_100._prim_part._M_dataplus._M_p != &local_100._prim_part.field_2) {
              operator_delete(local_100._prim_part._M_dataplus._M_p,
                              CONCAT71(local_100._prim_part.field_2._M_allocated_capacity._1_7_,
                                       local_100._prim_part.field_2._M_local_buf[0]) + 1);
            }
            iVar10 = iVar10 + -1;
          } while (iVar10 != 0);
          if (local_1f8._160_8_ != local_260._16_8_) {
            operator_delete((void *)local_1f8._160_8_,local_1f8._176_8_ + 1);
          }
          if ((pointer)local_1f8._128_8_ != local_128) {
            operator_delete((void *)local_1f8._128_8_,local_1f8._144_8_ + 1);
          }
          if ((undefined1 *)local_1f8._96_8_ != local_1f8 + 0x70) {
            operator_delete((void *)local_1f8._96_8_,local_1f8._112_8_ + 1);
          }
          if ((undefined1 *)local_1f8._64_8_ != local_1f8 + 0x50) {
            operator_delete((void *)local_1f8._64_8_,local_1f8._80_8_ + 1);
          }
          if ((undefined1 *)local_1f8._32_8_ != local_1f8 + 0x30) {
            operator_delete((void *)local_1f8._32_8_,local_1f8._48_8_ + 1);
          }
          if ((undefined1 *)local_1f8._0_8_ != local_1f8 + 0x10) {
            operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
          }
        }
        (local_200->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_start[uVar11] = mVar9;
        uVar11 = uVar11 + 1;
      } while (uVar11 < (ulong)(((long)local_218.
                                       super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_218.
                                       super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 4) *
                               0x4ec4ec4ec4ec4ec5));
    }
    ::std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
    ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                *)local_248,(_Link_type)local_248._16_8_);
LAB_003eef45:
    ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector(&local_218);
  }
  return bVar12;
}

Assistant:

bool BuildSkelTopology(
  const std::vector<value::token> &joints,
  std::vector<int> &dst,
  std::string *err) {

  if (joints.empty()) {
    return true;
  }

  std::vector<Path> paths(joints.size());
  for (size_t i = 0; i < joints.size(); i++) {
    Path p = Path(joints[i].str(), "");

    if (!p.is_valid()) {
      if (err) {
        (*err) += fmt::format("joints[{}] is invalid Prim path: `{}`", i, joints[i].str());
      }
      return false;
    }

    if (p.is_root_path()) {
      if (err) {
        (*err) += fmt::format("joints[{}] Root Prim path '/' cannot be used for joint Prim path.", i);
      }
      return false;
    }

    std::string _err;

    if (!pathutil::ValidatePrimPath(p, &_err)) {
      if (err) {
        (*err) += fmt::format("joints[{}] is not a valid Prim path: `{}`, reason = {}", i, joints[i].str(), _err);
      }
      return false;
    }
    
    paths[i] = p;
  }

  // path name <-> index map
  std::map<std::string, int> pathMap;
  for (size_t i = 0; i < paths.size(); i++) {
    pathMap[paths[i].prim_part()] = int(i); 
  }

  auto GetParentIndex = [](const std::map<std::string, int> &_pathMap, const Path &path) -> int {
    if (path.is_root_path()) {
      return -1;
    }
  
    // from pxrUSD's comment...
    //
    // Recurse over all ancestor paths, not just the direct parent.
    // For instance, if the map includes only paths 'a' and 'a/b/c',
    // 'a' will be treated as the parent of 'a/b/c'.
    //
    Path parentPath = path.get_parent_prim_path();
     
    uint32_t kMaxRec = 1024 * 128; // to avoid infinite loop.

    uint32_t depth = 0;
    while (parentPath.is_valid() && !parentPath.is_root_path()) {

      if (_pathMap.count(parentPath.prim_part())) {
        return _pathMap.at(parentPath.prim_part());
      } else {
      }

      parentPath = parentPath.get_parent_prim_path();
      depth++;

      if (depth >= kMaxRec) {
        // TODO: Report error
        return -1;
      } 
    }

    return -1;
  };

  dst.resize(joints.size());
  for (size_t i = 0; i < paths.size(); i++) {
    dst[i] = GetParentIndex(pathMap, paths[i]);
  }

  return true;
}